

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_python.cpp
# Opt level: O2

string * __thiscall
flatbuffers::python::PythonGenerator::GenIndents_abi_cxx11_
          (string *__return_storage_ptr__,PythonGenerator *this,int num)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_30,(char)num * (char)DAT_002fcfe8);
  std::operator+(__return_storage_ptr__,"\n",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  return __return_storage_ptr__;
}

Assistant:

std::string GenIndents(int num) const {
    return "\n" + std::string(num * Indent.length(), ' ');
  }